

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<char,_false,_5>_> __thiscall
immutable::rrb_details::rrb_drop_right<char,false,5>
          (rrb_details *this,ref<immutable::rrb<char,_false,_5>_> *in,uint32_t right)

{
  char cVar1;
  uint32_t uVar2;
  uint uVar3;
  rrb<char,_false,_5> *prVar4;
  leaf_node<char,_false> *plVar5;
  rrb<char,_false,_5> *prVar6;
  rrb<char,_false,_5> *prVar7;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_50;
  ref<immutable::rrb_details::tree_node<char,_false>_> root;
  uint local_40;
  uint32_t i;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_30;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  uint32_t new_tail_len;
  uint32_t tail_offset;
  uint32_t right_local;
  ref<immutable::rrb<char,_false,_5>_> *in_local;
  ref<immutable::rrb<char,_false,_5>_> *new_rrb;
  
  if (right == 0) {
    rrb_create<char,false,5>();
  }
  else {
    prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
    if (right < prVar4->cnt) {
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      uVar2 = prVar4->cnt;
      prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
      uVar3 = uVar2 - prVar4->tail_len;
      if (uVar3 < right) {
        new_tail.ptr._7_1_ = 0;
        prVar4 = rrb_head_clone<char,false,5>(in->ptr);
        ref<immutable::rrb<char,_false,_5>_>::ref
                  ((ref<immutable::rrb<char,_false,_5>_> *)this,prVar4);
        new_tail.ptr._0_4_ = right - uVar3;
        plVar5 = leaf_node_create<char,false>((uint32_t)new_tail.ptr);
        ref<immutable::rrb_details::leaf_node<char,_false>_>::ref(&local_30,plVar5);
        for (local_40 = 0; local_40 < (uint32_t)new_tail.ptr; local_40 = local_40 + 1) {
          prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
          plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar4->tail);
          cVar1 = plVar5->child[local_40];
          plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&local_30);
          plVar5->child[local_40] = cVar1;
        }
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar4->cnt = right;
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar4->tail,&local_30);
        uVar2 = (uint32_t)new_tail.ptr;
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar4->tail_len = uVar2;
        new_tail.ptr._7_1_ = 1;
        ref<immutable::rrb_details::leaf_node<char,_false>_>::~ref(&local_30);
        if ((new_tail.ptr._7_1_ & 1) == 0) {
          ref<immutable::rrb<char,_false,_5>_>::~ref((ref<immutable::rrb<char,_false,_5>_> *)this);
        }
      }
      else {
        root.ptr._7_1_ = 0;
        rrb_create<char,false,5>();
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar6 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        prVar7 = ref<immutable::rrb<char,_false,_5>_>::operator->(in);
        rrb_drop_right_rec<char,false,5>
                  ((rrb_details *)&local_50,&prVar4->shift,&prVar6->root,right - 1,prVar7->shift,
                   false);
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar4->cnt = right;
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        ref<immutable::rrb_details::tree_node<char,_false>_>::operator=(&prVar4->root,&local_50);
        promote_rightmost_leaf<char,false,5>((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&prVar4->tail);
        uVar2 = plVar5->len;
        prVar4 = ref<immutable::rrb<char,_false,_5>_>::operator->
                           ((ref<immutable::rrb<char,_false,_5>_> *)this);
        prVar4->tail_len = uVar2;
        root.ptr._7_1_ = 1;
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_50);
        if ((root.ptr._7_1_ & 1) == 0) {
          ref<immutable::rrb<char,_false,_5>_>::~ref((ref<immutable::rrb<char,_false,_5>_> *)this);
        }
      }
    }
    else {
      ref<immutable::rrb<char,_false,_5>_>::ref((ref<immutable::rrb<char,_false,_5>_> *)this,in);
    }
  }
  return (ref<immutable::rrb<char,_false,_5>_>)(rrb<char,_false,_5> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_drop_right(ref<rrb<T, atomic_ref_counting, N>> in, const uint32_t right)
      {
      using namespace rrb_details;
      if (right == 0)
        {
        return rrb_create<T, atomic_ref_counting, N>();
        }
      else if (right < in->cnt)
        {
        const uint32_t tail_offset = in->cnt - in->tail_len;
        // Can just cut the tail slightly
        if (tail_offset < right)
          {
          ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
          const uint32_t new_tail_len = right - tail_offset;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);
          //memcpy(new_tail->child, in->tail->child, new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = in->tail->child[i]; // don't memcpy, but use copy constructor

          new_rrb->cnt = right;
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }

        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
        ref<tree_node<T, atomic_ref_counting>> root = rrb_drop_right_rec<T, atomic_ref_counting, N>(&new_rrb->shift, in->root, right - 1, in->shift, false);
        new_rrb->cnt = right;
        new_rrb->root = root;

        // Not sure if this is necessary in this part of the program, due to issues
        // wrt. rrb_drop_left and roots without size tables.
        promote_rightmost_leaf(new_rrb);
        new_rrb->tail_len = new_rrb->tail->len;
        return new_rrb;
        }
      else
        {
        return in;
        }
      }